

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O1

double __thiscall Benchmark::getDeletionsTime(Benchmark *this,unsigned_long deletions)

{
  size_t *psVar1;
  size_t sVar2;
  iterator iVar3;
  int iVar4;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *peVar5;
  clock_t cVar6;
  clock_t cVar7;
  long lVar8;
  DynamicGraph *this_00;
  long lVar9;
  DynamicGraph *pDVar10;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *peVar11;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *local_68;
  iterator iStack_60;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *local_58;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_48;
  unsigned_long local_30;
  
  local_68 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  iStack_60._M_current = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  local_58 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  this_00 = &this->G;
  pDVar10 = this_00;
  do {
    pDVar10 = *(DynamicGraph **)
               &(pDVar10->super_UndirectedGraph).super_type.m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                ._M_impl._M_node.super__List_node_base;
    if (pDVar10 == this_00) break;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (pDVar10->super_UndirectedGraph).super_type.m_edges.
         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
         ._M_impl._M_node._M_size;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         (unsigned_long)
         (pDVar10->super_UndirectedGraph).super_type.m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.m_eproperty =
         &(pDVar10->super_UndirectedGraph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    if (iStack_60._M_current == local_58) {
      std::
      vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_realloc_insert<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                ((vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)&local_68,iStack_60,&local_48);
    }
    else {
      (iStack_60._M_current)->m_eproperty = local_48.m_eproperty;
      ((iStack_60._M_current)->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
           local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      ((iStack_60._M_current)->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
           local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    deletions = deletions - 1;
  } while (deletions != 0);
  iVar3._M_current = iStack_60._M_current;
  peVar11 = local_68;
  if ((local_68 != iStack_60._M_current) && (local_68 + 1 != iStack_60._M_current)) {
    lVar9 = 0x18;
    do {
      iVar4 = rand();
      lVar8 = (long)iVar4 % ((lVar9 >> 3) * -0x5555555555555555 + 1);
      if (lVar9 != lVar8 * 0x18) {
        psVar1 = (size_t *)
                 ((long)&(peVar11->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source +
                 lVar9);
        peVar5 = peVar11 + lVar8;
        local_48.m_eproperty = (property_type *)psVar1[2];
        local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = *psVar1;
        local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = psVar1[1];
        psVar1[2] = (size_t)peVar5->m_eproperty;
        sVar2 = (peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
        *psVar1 = (peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
        psVar1[1] = sVar2;
        peVar5->m_eproperty = local_48.m_eproperty;
        (peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
             local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
        (peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
             local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      }
      peVar5 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
               ((long)&peVar11[1].super_edge_base<boost::undirected_tag,_unsigned_long>.m_source +
               lVar9);
      lVar9 = lVar9 + 0x18;
    } while (peVar5 != iVar3._M_current);
  }
  cVar6 = clock();
  if (local_68 != iStack_60._M_current) {
    peVar11 = local_68;
    do {
      local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           (peVar11->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
      local_30 = (peVar11->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
      DynamicGraph::deleteEdge(this_00,(Vertex *)&local_48,&local_30);
      peVar11 = peVar11 + 1;
    } while (peVar11 != iStack_60._M_current);
  }
  cVar7 = clock();
  if (local_68 != (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return (double)(cVar7 - cVar6) / 1000000.0;
}

Assistant:

double Benchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    // get deletions number of edges
    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    // shuffle them
    std::random_shuffle(edges.begin(), edges.end());

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}